

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_flash_ff(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b0,ggml_tensor *b1,ggml_tensor *c0,
             ggml_tensor *c1)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  _Var1 = ggml_can_mul_mat(b0,a);
  if (_Var1) {
    if ((((a->grad == (ggml_tensor *)0x0) && (b0->grad == (ggml_tensor *)0x0)) &&
        (b1->grad == (ggml_tensor *)0x0)) &&
       ((c0->grad == (ggml_tensor *)0x0 && (c1->grad == (ggml_tensor *)0x0)))) {
      pgVar2 = ggml_new_tensor(ctx,GGML_TYPE_F32,4,a->ne);
      pgVar2->op = GGML_OP_FLASH_FF;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = b0;
      pgVar2->opt[0] = b1;
      pgVar2->opt[1] = c0;
      pgVar2->opt[2] = c1;
      return pgVar2;
    }
    pcVar4 = "false";
    uVar3 = 0x1062;
  }
  else {
    pcVar4 = "ggml_can_mul_mat(b0, a)";
    uVar3 = 0x105c;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar3,
          pcVar4);
  abort();
}

Assistant:

struct ggml_tensor * ggml_flash_ff(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b0,
        struct ggml_tensor  * b1,
        struct ggml_tensor  * c0,
        struct ggml_tensor  * c1) {
    GGML_ASSERT(ggml_can_mul_mat(b0, a));
    // TODO: more checks

    bool is_node = false;

    if (a->grad || b0->grad || b1->grad || c0->grad || c1->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    //struct ggml_tensor * result = ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, a->ne);

    result->op   = GGML_OP_FLASH_FF;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b0;
    result->opt[0] = b1;
    result->opt[1] = c0;
    result->opt[2] = c1;

    return result;
}